

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void benchmark::anon_unknown_1::RunInThread
               (Instance *b,size_t iters,int thread_id,ThreadStats *total)

{
  ostream *poVar1;
  long *in_RCX;
  long in_RDI;
  MutexLock l;
  State st;
  Mutex *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  CheckHandler *in_stack_ffffffffffffff20;
  TimerManager *in_stack_ffffffffffffff40;
  CheckHandler local_a8 [2];
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  State *in_stack_ffffffffffffff80;
  long local_68;
  long local_60;
  int local_58;
  size_t local_48;
  
  State::State(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))
            (*(long **)(in_RDI + 0x20),&stack0xffffffffffffff70);
  if (in_stack_ffffffffffffff78 != local_48) {
    internal::CheckHandler::CheckHandler
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    poVar1 = internal::CheckHandler::GetLog(local_a8);
  }
  else {
    poVar1 = internal::GetNullLogInstance();
  }
  std::operator<<(poVar1,"Benchmark returned before State::KeepRunning() returned false!");
  if (in_stack_ffffffffffffff78 == local_48) {
    GetBenchmarkLock();
    MutexLock::MutexLock
              ((MutexLock *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    *in_RCX = local_68 + *in_RCX;
    in_RCX[1] = local_60 + in_RCX[1];
    *(int *)(in_RCX + 2) = (int)in_RCX[2] + local_58;
    MutexLock::~MutexLock((MutexLock *)0x16aa6c);
    std::
    unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
    ::operator->((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  *)0x16aa78);
    TimerManager::Finalize(in_stack_ffffffffffffff40);
    State::~State((State *)0x16aa8c);
    return;
  }
  internal::CheckHandler::~CheckHandler((CheckHandler *)&UNK_0016a97e);
}

Assistant:

EXCLUDES(GetBenchmarkLock()) {
  State st(iters, b->arg, thread_id, b->threads);
  b->benchmark->Run(st);
  CHECK(st.iterations() == st.max_iterations) <<
    "Benchmark returned before State::KeepRunning() returned false!";
  {
    MutexLock l(GetBenchmarkLock());
    total->bytes_processed += st.bytes_processed();
    total->items_processed += st.items_processed();
    total->complexity_n += st.complexity_length_n();
  }

  timer_manager->Finalize();
}